

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.h
# Opt level: O2

size_t sdsavail(sds s)

{
  ulong uVar1;
  ulong uVar2;
  
  switch(s[-1] & 7) {
  case 1:
    uVar1 = (ulong)(byte)s[-2];
    uVar2 = (ulong)(byte)s[-3];
    break;
  case 2:
    uVar1 = (ulong)*(ushort *)(s + -3);
    uVar2 = (ulong)*(ushort *)(s + -5);
    break;
  case 3:
    return (ulong)(uint)(*(int *)(s + -5) - *(int *)(s + -9));
  case 4:
    return *(long *)(s + -9) - *(long *)(s + -0x11);
  default:
    return 0;
  }
  return uVar1 - uVar2;
}

Assistant:

static inline size_t sdsavail(const sds s) {
    unsigned char flags = s[-1];
    switch(flags&SDS_TYPE_MASK) {
        case SDS_TYPE_5: {
            return 0;
        }
        case SDS_TYPE_8: {
            SDS_HDR_VAR(8,s);
            return sh->alloc - sh->len;
        }
        case SDS_TYPE_16: {
            SDS_HDR_VAR(16,s);
            return sh->alloc - sh->len;
        }
        case SDS_TYPE_32: {
            SDS_HDR_VAR(32,s);
            return sh->alloc - sh->len;
        }
        case SDS_TYPE_64: {
            SDS_HDR_VAR(64,s);
            return sh->alloc - sh->len;
        }
    }
    return 0;
}